

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O0

void __thiscall
OpenMD::CoordinationNumber::CoordinationNumber
          (CoordinationNumber *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType rCut,int bins)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  SelectionEvaluator *this_00;
  string *in_RCX;
  undefined8 *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  string paramString;
  stringstream params;
  RealType binMax_;
  undefined4 in_stack_fffffffffffffcd8;
  uint in_stack_fffffffffffffcdc;
  StaticAnalyser *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar4;
  int in_stack_fffffffffffffcec;
  StaticAnalyser *in_stack_fffffffffffffcf0;
  allocator<char> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  string *script;
  SelectionEvaluator *this_01;
  string local_260 [32];
  stringstream local_240 [16];
  ostream local_230 [8];
  SimInfo *in_stack_fffffffffffffdd8;
  SelectionEvaluator *in_stack_fffffffffffffde0;
  string local_b0 [32];
  string local_90 [24];
  SimInfo *in_stack_ffffffffffffff88;
  SelectionManager *in_stack_ffffffffffffff90;
  undefined4 local_34;
  undefined8 local_30;
  string *local_28;
  string *local_20;
  
  local_34 = in_R9D;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffcf0,
             (SimInfo *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             (string *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
  *in_RDI = &PTR__CoordinationNumber_0055f0a8;
  in_RDI[0x19] = local_30;
  *(undefined4 *)(in_RDI + 0x1a) = local_34;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),local_20);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::__cxx11::string::string((string *)(in_RDI + 0xe2),local_28);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  script = (string *)(in_RDI + 0x1ad);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1605d5);
  this_01 = (SelectionEvaluator *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  StaticAnalyser::setAnalysisType
            (in_stack_fffffffffffffce0,
             (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  getPrefix((string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                 (char *)in_stack_fffffffffffffce0);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffce0,
             (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  *(undefined4 *)(in_RDI + 0x1aa) = 0xc;
  in_RDI[0x1ab] = ((double)*(int *)(in_RDI + 0x1aa) * 1.5) / (double)*(int *)(in_RDI + 0x1a);
  std::__cxx11::stringstream::stringstream(local_240);
  poVar3 = std::operator<<(local_230," rcut = ");
  this_00 = (SelectionEvaluator *)std::ostream::operator<<(poVar3,(double)in_RDI[0x19]);
  poVar3 = std::operator<<((ostream *)this_00,", nbins = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1a));
  poVar3 = std::operator<<(poVar3,", nnMax = ");
  std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1aa));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString
            (in_stack_fffffffffffffce0,
             (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  SelectionEvaluator::loadScriptString(this_01,script);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x38));
  if (!bVar1) {
    in_stack_fffffffffffffcf0 = (StaticAnalyser *)(in_RDI + 0x1f);
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffcf0,
               (SelectionSet *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    SelectionSet::~SelectionSet((SelectionSet *)0x16085a);
    in_stack_fffffffffffffcec = SelectionManager::getSelectionCount((SelectionManager *)0x16086e);
    *(int *)(in_RDI + 0x1a9) = in_stack_fffffffffffffcec;
  }
  SelectionEvaluator::loadScriptString(this_01,script);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xff));
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffce8);
  if (!bVar1) {
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffcf0,
               (SelectionSet *)CONCAT44(in_stack_fffffffffffffcec,uVar4));
    SelectionSet::~SelectionSet((SelectionSet *)0x160ab7);
    iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x160acb);
    *(int *)((long)in_RDI + 0xd4c) = iVar2;
  }
  std::__cxx11::string::~string(local_260);
  std::__cxx11::stringstream::~stringstream(local_240);
  return;
}

Assistant:

CoordinationNumber::CoordinationNumber(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele1,
                                         const std::string& sele2,
                                         RealType rCut, int bins) :
      StaticAnalyser(info, filename, bins),
      rCut_(rCut), bins_(bins), sele1_(sele1), seleMan1_(info),
      evaluator1_(info), sele2_(sele2), seleMan2_(info), evaluator2_(info) {
    setAnalysisType("Coordination Number Distribution");
    setOutputName(getPrefix(filename) + ".cn");

    nnMax_           = 12;
    RealType binMax_ = nnMax_ * 1.5;
    delta_           = binMax_ / bins_;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << bins_
           << ", nnMax = " << nnMax_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      selectionCount1_ = seleMan1_.getSelectionCount();
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      selectionCount2_ = seleMan2_.getSelectionCount();
    }
  }